

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

void memcpy_pad(void *dst,size_t dst_len,void *src,size_t src_len,size_t offset)

{
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  void *in_RDI;
  ulong in_R8;
  size_t copy_bytes;
  uint8_t *src_c;
  uint8_t *dst_c;
  undefined8 local_50;
  undefined8 local_48;
  
  if (in_RCX < in_R8) {
    local_48 = 0;
  }
  else {
    local_48 = in_RCX - in_R8;
  }
  local_50 = in_RSI;
  if (local_48 <= in_RSI) {
    local_50 = local_48;
  }
  memcpy(in_RDI,(void *)(in_RDX + in_R8),local_50);
  memset((void *)((long)in_RDI + local_50),0,in_RSI - local_50);
  return;
}

Assistant:

static inline void memcpy_pad(void* dst, size_t dst_len, const void* src, size_t src_len, size_t offset) {
	uint8_t* dst_c = dst;
	const uint8_t* src_c = src;

	/* how many bytes can be copied without overrunning `src` */
	size_t copy_bytes = (src_len >= offset) ? (src_len - offset) : 0;
	copy_bytes = copy_bytes > dst_len ? dst_len : copy_bytes;

	memcpy(dst_c, src_c + offset, copy_bytes);
	/* padded bytes */
	memset(dst_c + copy_bytes, 0, dst_len - copy_bytes);
}